

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_3)

{
  bool bVar1;
  string_type sStack_58;
  value_type local_38;
  
  bVar1 = option::matches(&this->super_option,url,method);
  if (bVar1) {
    booster::match_results<const_char_*>::operator[]
              (&local_38,&(this->super_option).match_,this->select_[0]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&sStack_58,&local_38);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&this->handle_,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return bVar1;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}